

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uint8_t __thiscall Palette::indexOf(Palette *this,uint16_t color)

{
  uint8_t uVar1;
  unsigned_short *puVar2;
  undefined6 in_register_00000032;
  uint16_t local_a;
  
  if ((int)CONCAT62(in_register_00000032,color) == 0x8000) {
    uVar1 = '\0';
  }
  else {
    local_a = color;
    puVar2 = std::
             __find_if<unsigned_short_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                       ((this->colors)._M_elems + options.hasTransparentPixels,this + 1,&local_a);
    uVar1 = (char)((int)puVar2 - ((int)this + (uint)options.hasTransparentPixels * 2) >> 1) +
            options.hasTransparentPixels;
  }
  return uVar1;
}

Assistant:

uint8_t Palette::indexOf(uint16_t color) const {
	return color == Rgba::transparent
	           ? 0
	           : std::find(begin(), colors.end(), color) - begin() + options.hasTransparentPixels;
}